

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhash.cpp
# Opt level: O0

void * uhash_iput_63(UHashtable *hash,int32_t key,void *value,UErrorCode *status)

{
  UHashTok UVar1;
  UHashTok valueholder;
  UHashTok keyholder;
  UErrorCode *status_local;
  void *value_local;
  int32_t key_local;
  UHashtable *hash_local;
  
  UVar1._4_4_ = valueholder._4_4_;
  UVar1.integer = key;
  UVar1 = _uhash_put(hash,UVar1,value,'\x02',status);
  return UVar1.pointer;
}

Assistant:

U_CAPI void* U_EXPORT2
uhash_iput(UHashtable *hash,
           int32_t key,
           void* value,
           UErrorCode *status) {
    UHashTok keyholder, valueholder;
    keyholder.integer = key;
    valueholder.pointer = value;
    return _uhash_put(hash, keyholder, valueholder,
                      HINT_VALUE_POINTER,
                      status).pointer;
}